

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::sendToAt
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,
          string_view destination,Time sendTime)

{
  atomic<int> *paVar1;
  size_t sVar2;
  string_view string3;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var6;
  FederateState *this_00;
  void *pvVar7;
  InvalidIdentifier *this_01;
  HelicsException *this_02;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  long lVar12;
  string_view message_00;
  string_view message_01;
  string_view string2;
  byte *st1;
  ActionMessage message;
  undefined1 local_e8 [26];
  uint16_t local_ce;
  Time local_c8;
  SmallBuffer local_a8;
  
  pcVar8 = destination._M_str;
  sVar10 = destination._M_len;
  if (sVar10 == 0) {
    sendAt(this,sourceHandle,data,length,sendTime);
    return;
  }
  p_Var6 = getHandleInfo(this,sourceHandle);
  if (p_Var6 == (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar8 = "handle is not valid";
    sVar9 = 0x13;
LAB_002a9e2d:
    message_00._M_str = pcVar8;
    message_00._M_len = sVar9;
    InvalidIdentifier::InvalidIdentifier(this_01,message_00);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if ((p_Var6->
      super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ).
      super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
      ._M_storage._M_storage.__data[4] != 'e') {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar8 = "handle does not point to an endpoint";
    sVar9 = 0x24;
    goto LAB_002a9e2d;
  }
  this_00 = getFederateAt(this,(LocalFederateId)
                               *(BaseType *)
                                &(p_Var6->
                                 super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                                 ._M_storage._M_storage);
  if (((p_Var6->
       super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
       ).
       super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
       ._M_storage._M_storage.__data[7] & 4) == 0) goto LAB_002a9cfb;
  FederateState::getMessageDestinations
            ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)local_e8,this_00,sourceHandle);
  pvVar3 = (void *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
  pvVar4 = (void *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
  lVar12 = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555 >> 2;
  pvVar7 = pvVar3;
  if (0 < lVar12) {
    pvVar7 = (void *)(lVar12 * 0x60 + (long)pvVar3);
    lVar12 = lVar12 + 1;
    pvVar11 = (void *)((long)pvVar3 + 0x30);
    do {
      sVar2 = *(size_t *)((long)pvVar11 + -0x28);
      if ((sVar2 == sVar10) &&
         ((sVar2 == 0 || (iVar5 = bcmp(*(void **)((long)pvVar11 + -0x20),pcVar8,sVar2), iVar5 == 0))
         )) {
        pvVar11 = (void *)((long)pvVar11 + -0x30);
        goto LAB_002a9cd1;
      }
      sVar2 = *(size_t *)((long)pvVar11 + -0x10);
      if ((sVar2 == sVar10) &&
         ((sVar2 == 0 || (iVar5 = bcmp(*(void **)((long)pvVar11 + -8),pcVar8,sVar2), iVar5 == 0))))
      {
        pvVar11 = (void *)((long)pvVar11 + -0x18);
        goto LAB_002a9cd1;
      }
      sVar2 = *(size_t *)((long)pvVar11 + 8);
      if ((sVar2 == sVar10) &&
         ((sVar2 == 0 || (iVar5 = bcmp(*(void **)((long)pvVar11 + 0x10),pcVar8,sVar2), iVar5 == 0)))
         ) goto LAB_002a9cd1;
      sVar2 = *(size_t *)((long)pvVar11 + 0x20);
      if ((sVar2 == sVar10) &&
         ((sVar2 == 0 || (iVar5 = bcmp(*(void **)((long)pvVar11 + 0x28),pcVar8,sVar2), iVar5 == 0)))
         ) {
        pvVar11 = (void *)((long)pvVar11 + 0x18);
        goto LAB_002a9cd1;
      }
      lVar12 = lVar12 + -1;
      pvVar11 = (void *)((long)pvVar11 + 0x60);
    } while (1 < lVar12);
  }
  lVar12 = ((long)pvVar4 - (long)pvVar7 >> 3) * -0x5555555555555555;
  if (lVar12 == 1) {
LAB_002a9c93:
    sVar2 = *(size_t *)((long)pvVar7 + 8);
    pvVar11 = pvVar4;
    if (((sVar2 == sVar10) && (pvVar11 = pvVar7, sVar2 != 0)) &&
       (iVar5 = bcmp(*(void **)((long)pvVar7 + 0x10),pcVar8,sVar2), iVar5 != 0)) {
      pvVar11 = pvVar4;
    }
  }
  else if (lVar12 == 2) {
LAB_002a9c4a:
    sVar2 = *(size_t *)((long)pvVar7 + 8);
    if ((sVar2 != sVar10) ||
       ((pvVar11 = pvVar7, sVar2 != 0 &&
        (iVar5 = bcmp(*(void **)((long)pvVar7 + 0x10),pcVar8,sVar2), iVar5 != 0)))) {
      pvVar7 = (void *)((long)pvVar7 + 0x18);
      goto LAB_002a9c93;
    }
  }
  else {
    pvVar11 = pvVar4;
    if ((lVar12 == 3) &&
       ((sVar2 = *(size_t *)((long)pvVar7 + 8), sVar2 != sVar10 ||
        ((pvVar11 = pvVar7, sVar2 != 0 &&
         (iVar5 = bcmp(*(void **)((long)pvVar7 + 0x10),pcVar8,sVar2), iVar5 != 0)))))) {
      pvVar7 = (void *)((long)pvVar7 + 0x18);
      goto LAB_002a9c4a;
    }
  }
LAB_002a9cd1:
  if (pvVar11 == pvVar4) {
    this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
    message_01._M_str = "targeted endpoint destination not in target list";
    message_01._M_len = 0x30;
    HelicsException::HelicsException(this_02,message_01);
    *(undefined ***)this_02 = &PTR__HelicsException_004cb740;
    __cxa_throw(this_02,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_e8._16_8_ - (long)pvVar3);
  }
LAB_002a9cfb:
  ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_send_message);
  LOCK();
  paVar1 = &this->messageCounter;
  local_e8._4_4_ = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_e8._4_4_ = local_e8._4_4_ + 1;
  local_e8._8_4_ = *(undefined4 *)&(p_Var6->super__Hash_node_base)._M_nxt;
  lVar12 = (this_00->allowed_send_time).internalTimeCode;
  local_c8.internalTimeCode = sendTime.internalTimeCode;
  if (sendTime.internalTimeCode < lVar12) {
    local_c8.internalTimeCode = lVar12;
  }
  local_ce = *(uint16_t *)
              ((long)&(p_Var6->
                      super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                      ._M_storage._M_storage + 6);
  local_e8._12_4_ = sourceHandle.hid;
  SmallBuffer::reserve(&local_a8,length);
  local_a8.bufferSize = length;
  memcpy(local_a8.heap,data,length);
  pcVar8 = *(char **)((long)&(p_Var6->
                             super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                             ._M_storage._M_storage + 8);
  sVar9 = *(size_t *)
           ((long)&(p_Var6->
                   super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                   ._M_storage._M_storage + 0x10);
  string3._M_str = pcVar8;
  string3._M_len = sVar9;
  string2._M_str = pcVar8;
  string2._M_len = sVar9;
  ActionMessage::setStringData((ActionMessage *)local_e8,destination,string2,string3);
  BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  return;
}

Assistant:

void CommonCore::sendToAt(InterfaceHandle sourceHandle,
                          const void* data,
                          uint64_t length,
                          std::string_view destination,
                          Time sendTime)
{
    if (destination.empty()) {
        // sendToAt should be the equivalent of sendAt if there is an empty destination
        sendAt(sourceHandle, data, length, sendTime);
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }

    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    if (checkActionFlag(*hndl, targeted_flag)) {
        auto targets = fed->getMessageDestinations(sourceHandle);
        auto res = std::find_if(targets.begin(), targets.end(), [destination](const auto& val) {
            return (val.second == destination);
        });
        if (res == targets.end()) {
            throw(InvalidParameter("targeted endpoint destination not in target list"));
        }
    }

    ActionMessage message(CMD_SEND_MESSAGE);

    message.messageID = ++messageCounter;
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    auto minTime = fed->nextAllowedSendTime();
    message.actionTime = std::max(sendTime, minTime);
    message.flags = hndl->flags;

    message.payload.assign(data, length);
    message.setStringData(destination, hndl->key, hndl->key);

    addActionMessage(std::move(message));
}